

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Infector_multi.hpp
# Opt level: O0

unique_ptr<Kaaa,_std::default_delete<Kaaa>_> __thiscall
Infector::Container::build_delegate<Kaaa>(Container *this)

{
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer __p;
  Container *in_RSI;
  unique_ptr<Kaaa,_std::default_delete<Kaaa>_> local_48;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  local_38;
  iterator it2;
  type_index local_28;
  _Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
  local_20;
  iterator it;
  Container *this_local;
  
  std::type_index::type_index(&local_28,(type_info *)&Kaaa::typeinfo);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
       ::find(&in_RSI->typeMap,&local_28);
  it2.
  super__Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false>
             )std::
              unordered_map<std::type_index,_Infector::Container::Binding,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_Infector::Container::Binding>_>_>
              ::end(&in_RSI->typeMap);
  bVar1 = std::__detail::operator==
                    (&local_20,
                     (_Node_iterator_base<std::pair<const_std::type_index,_Infector::Container::Binding>,_false>
                      *)&it2);
  if (bVar1) {
    launch_exception<Infector::ExBuildWhat>(in_RSI);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  if (((ppVar2->second).single & 1U) == 1) {
    launch_exception<Infector::ExSingleMulti>(in_RSI);
  }
  ppVar2 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_Infector::Container::Binding>,_false,_false>
                         *)&local_20);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
       ::find(&in_RSI->callbacks,&(ppVar2->second).type);
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>,_std::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>_>_>
       ::end(&in_RSI->callbacks);
  bVar1 = std::__detail::operator==(&local_38,&local_40);
  if (bVar1) {
    launch_exception<Infector::ExNotWired>(in_RSI);
  }
  ppVar3 = std::__detail::
           _Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
           ::operator->((_Node_iterator<std::pair<const_std::type_index,_std::function<void_*(Infector::Container::EmplaceContext_*)>_>,_false,_false>
                         *)&local_38);
  __p = (pointer)std::function<void_*(Infector::Container::EmplaceContext_*)>::operator()
                           (&ppVar3->second,(EmplaceContext *)0x0);
  std::unique_ptr<Kaaa,std::default_delete<Kaaa>>::unique_ptr<std::default_delete<Kaaa>,void>
            ((unique_ptr<Kaaa,std::default_delete<Kaaa>> *)&local_48,__p);
  std::unique_ptr<Kaaa,_std::default_delete<Kaaa>_>::unique_ptr
            ((unique_ptr<Kaaa,_std::default_delete<Kaaa>_> *)this,&local_48);
  std::unique_ptr<Kaaa,_std::default_delete<Kaaa>_>::~unique_ptr(&local_48);
  return (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)
         (__uniq_ptr_data<Kaaa,_std::default_delete<Kaaa>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> Container::build_delegate(){
        auto it = typeMap.find( std::type_index(typeid(T)) );
        if( it==typeMap.end())
            launch_exception<ExBuildWhat>(); // TYPE NOT REGISTERED

        if( it->second.single == true) ///!!!!!
            launch_exception<ExSingleMulti>(); // T must be multi

        auto it2 = callbacks.find( it->second.type ); //find constructor

        if( it2==callbacks.end() )
            launch_exception<ExNotWired>(); // CONSTRUCTOR NOT WIRED

        return std::move(
                    std::unique_ptr<T>(reinterpret_cast<T*>( (it2->second)(nullptr) ))
                    );
    }